

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<void*>
          (BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,void **key,
          MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
          **value)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  hash_t hVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar2 = *(long *)this;
  uVar5 = 0;
  if (lVar2 != 0) {
    hVar4 = Js::SameValueComparerCommon<void_*,_true>::GetHashCode(*key);
    uVar5 = BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(hVar4 * 2 + 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar1 = *(uint *)(lVar2 + (ulong)uVar5 * 4);
    uVar5 = 0;
    if (-1 < (int)uVar1) {
      lVar2 = *(long *)(this + 8);
      uVar5 = 0;
      do {
        uVar6 = (ulong)uVar1;
        bVar3 = Js::JavascriptConversion::SameValueCommon<true>
                          (*(Var *)(lVar2 + 0x10 + uVar6 * 0x18),*key);
        if (bVar3) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar5);
          }
          *value = *(MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                     **)(*(long *)(this + 8) + uVar6 * 0x18);
          return true;
        }
        uVar5 = uVar5 + 1;
        uVar1 = *(uint *)(uVar6 * 0x18 + lVar2 + 8);
      } while (-1 < (int)uVar1);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar5);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }